

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void typeofFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  byte bVar1;
  char *z;
  
  bVar1 = (*argv)->type - 1;
  if (bVar1 < 4) {
    z = &DAT_0018a6fc + *(int *)(&DAT_0018a6fc + (ulong)bVar1 * 4);
  }
  else {
    z = "null";
  }
  sqlite3_result_text(context,z,-1,(_func_void_void_ptr *)0x0);
  return;
}

Assistant:

static void typeofFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  const char *z = 0;
  UNUSED_PARAMETER(NotUsed);
  switch( sqlite3_value_type(argv[0]) ){
    case SQLITE_INTEGER: z = "integer"; break;
    case SQLITE_TEXT:    z = "text";    break;
    case SQLITE_FLOAT:   z = "real";    break;
    case SQLITE_BLOB:    z = "blob";    break;
    default:             z = "null";    break;
  }
  sqlite3_result_text(context, z, -1, SQLITE_STATIC);
}